

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_integer_sequence.cpp
# Opt level: O0

uint get_ise_sequence_bitcount(uint character_count,quant_method quant_level)

{
  ulong __n;
  size_type sVar1;
  const_reference pvVar2;
  uint in_ESI;
  int in_EDI;
  uint divisor;
  value_type *entry;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint local_4;
  
  __n = (ulong)in_ESI;
  sVar1 = std::array<ise_size,_21UL>::size(&ise_sizes);
  if (__n < sVar1) {
    pvVar2 = std::array<ise_size,_21UL>::operator[]
                       ((array<ise_size,_21UL> *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),__n);
    local_4 = (uint)((byte)*pvVar2 >> 6) * 2 + 1;
    local_4 = (((uint)((byte)*pvVar2 & 0x3f) * in_EDI + local_4) - 1) / local_4;
  }
  else {
    local_4 = 0x400;
  }
  return local_4;
}

Assistant:

unsigned int get_ise_sequence_bitcount(
	unsigned int character_count,
	quant_method quant_level
) {
	// Cope with out-of bounds values - input might be invalid
	if (static_cast<size_t>(quant_level) >= ise_sizes.size())
	{
		// Arbitrary large number that's more than an ASTC block can hold
		return 1024;
	}

	auto& entry = ise_sizes[quant_level];
	unsigned int divisor = (entry.divisor << 1) + 1;
	return (entry.scale * character_count + divisor - 1) / divisor;
}